

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int validate_inputs(argon2_context *context)

{
  uint uVar1;
  int iVar2;
  
  if (context == (argon2_context *)0x0) {
    iVar2 = -0x19;
  }
  else if (context->out == (uint8_t *)0x0) {
    iVar2 = -1;
  }
  else if (context->outlen < 4) {
    iVar2 = -2;
  }
  else if ((context->pwd == (uint8_t *)0x0) && (context->pwdlen != 0)) {
    iVar2 = -0x12;
  }
  else {
    if (context->salt == (uint8_t *)0x0) {
      iVar2 = -0x13;
      if (context->saltlen == 0) {
        iVar2 = -6;
      }
      return iVar2;
    }
    if (context->saltlen < 8) {
      iVar2 = -6;
    }
    else if ((context->secret == (uint8_t *)0x0) && (context->secretlen != 0)) {
      iVar2 = -0x14;
    }
    else if ((context->ad == (uint8_t *)0x0) && (context->adlen != 0)) {
      iVar2 = -0x15;
    }
    else {
      if ((context->m_cost < 8) || (uVar1 = context->lanes, context->m_cost < uVar1 * 8)) {
        return -0xe;
      }
      if (context->t_cost == 0) {
        iVar2 = -0xc;
      }
      else if (uVar1 == 0) {
        iVar2 = -0x10;
      }
      else if (uVar1 < 0x1000000) {
        if (context->threads == 0) {
          iVar2 = -0x1c;
        }
        else if (context->threads < 0x1000000) {
          if (context->allocate_cbk == (allocate_fptr)0x0) {
            if (context->free_cbk == (deallocate_fptr)0x0) {
              return 0;
            }
            iVar2 = -0x18;
          }
          else {
            if (context->free_cbk != (deallocate_fptr)0x0) {
              return 0;
            }
            iVar2 = -0x17;
          }
        }
        else {
          iVar2 = -0x1d;
        }
      }
      else {
        iVar2 = -0x11;
      }
    }
  }
  return iVar2;
}

Assistant:

int validate_inputs(const argon2_context *context) {
    if (NULL == context) {
        return ARGON2_INCORRECT_PARAMETER;
    }

    if (NULL == context->out) {
        return ARGON2_OUTPUT_PTR_NULL;
    }

    /* Validate output length */
    if (ARGON2_MIN_OUTLEN > context->outlen) {
        return ARGON2_OUTPUT_TOO_SHORT;
    }

    if (ARGON2_MAX_OUTLEN < context->outlen) {
        return ARGON2_OUTPUT_TOO_LONG;
    }

    /* Validate password (required param) */
    if (NULL == context->pwd) {
        if (0 != context->pwdlen) {
            return ARGON2_PWD_PTR_MISMATCH;
        }
    }

    if (ARGON2_MIN_PWD_LENGTH > context->pwdlen) {
        return ARGON2_PWD_TOO_SHORT;
    }

    if (ARGON2_MAX_PWD_LENGTH < context->pwdlen) {
        return ARGON2_PWD_TOO_LONG;
    }

    /* Validate salt (required param) */
    if (NULL == context->salt) {
        if (0 != context->saltlen) {
            return ARGON2_SALT_PTR_MISMATCH;
        }
    }

    if (ARGON2_MIN_SALT_LENGTH > context->saltlen) {
        return ARGON2_SALT_TOO_SHORT;
    }

    if (ARGON2_MAX_SALT_LENGTH < context->saltlen) {
        return ARGON2_SALT_TOO_LONG;
    }

    /* Validate secret (optional param) */
    if (NULL == context->secret) {
        if (0 != context->secretlen) {
            return ARGON2_SECRET_PTR_MISMATCH;
        }
    } else {
        if (ARGON2_MIN_SECRET > context->secretlen) {
            return ARGON2_SECRET_TOO_SHORT;
        }
        if (ARGON2_MAX_SECRET < context->secretlen) {
            return ARGON2_SECRET_TOO_LONG;
        }
    }

    /* Validate associated data (optional param) */
    if (NULL == context->ad) {
        if (0 != context->adlen) {
            return ARGON2_AD_PTR_MISMATCH;
        }
    } else {
        if (ARGON2_MIN_AD_LENGTH > context->adlen) {
            return ARGON2_AD_TOO_SHORT;
        }
        if (ARGON2_MAX_AD_LENGTH < context->adlen) {
            return ARGON2_AD_TOO_LONG;
        }
    }

    /* Validate memory cost */
    if (ARGON2_MIN_MEMORY > context->m_cost) {
        return ARGON2_MEMORY_TOO_LITTLE;
    }

    if (ARGON2_MAX_MEMORY < context->m_cost) {
        return ARGON2_MEMORY_TOO_MUCH;
    }

    if (context->m_cost < 8 * context->lanes) {
        return ARGON2_MEMORY_TOO_LITTLE;
    }

    /* Validate time cost */
    if (ARGON2_MIN_TIME > context->t_cost) {
        return ARGON2_TIME_TOO_SMALL;
    }

    if (ARGON2_MAX_TIME < context->t_cost) {
        return ARGON2_TIME_TOO_LARGE;
    }

    /* Validate lanes */
    if (ARGON2_MIN_LANES > context->lanes) {
        return ARGON2_LANES_TOO_FEW;
    }

    if (ARGON2_MAX_LANES < context->lanes) {
        return ARGON2_LANES_TOO_MANY;
    }

    /* Validate threads */
    if (ARGON2_MIN_THREADS > context->threads) {
        return ARGON2_THREADS_TOO_FEW;
    }

    if (ARGON2_MAX_THREADS < context->threads) {
        return ARGON2_THREADS_TOO_MANY;
    }

    if (NULL != context->allocate_cbk && NULL == context->free_cbk) {
        return ARGON2_FREE_MEMORY_CBK_NULL;
    }

    if (NULL == context->allocate_cbk && NULL != context->free_cbk) {
        return ARGON2_ALLOCATE_MEMORY_CBK_NULL;
    }

    return ARGON2_OK;
}